

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O1

void __thiscall RangeLock_TryLockSucceeds_Test::TestBody(RangeLock_TryLockSucceeds_Test *this)

{
  bool bVar1;
  TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *this_00;
  ActionInterface<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *impl;
  TypedExpectation<void_(unsigned_long,_unsigned_long)> *this_01;
  MatcherBase<pstore::file::file_base::blocking_mode> *gmock_a3;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  range_lock lock;
  mock_file file;
  _Any_data local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  undefined1 local_498 [8];
  VTable *local_490;
  MatcherBase<unsigned_long> local_480;
  MatcherBase<pstore::file::file_base::lock_kind> local_468;
  bool *local_450;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_448;
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  local_440;
  MatcherBase<pstore::file::file_base::blocking_mode> local_3d8;
  mock_file local_3c0;
  
  anon_unknown.dwarf_1432f::mock_file::mock_file(&local_3c0);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)local_498,5);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_480,7);
  testing::Matcher<pstore::file::file_base::lock_kind>::Matcher
            ((Matcher<pstore::file::file_base::lock_kind> *)&local_468,exclusive_write);
  testing::Matcher<pstore::file::file_base::blocking_mode>::Matcher
            ((Matcher<pstore::file::file_base::blocking_mode> *)&local_3d8,non_blocking);
  gmock_a3 = &local_3d8;
  anon_unknown.dwarf_1432f::mock_file::gmock_lock
            (&local_440,&local_3c0,(Matcher<unsigned_long> *)local_498,
             (Matcher<unsigned_long> *)&local_480,
             (Matcher<pstore::file::file_base::lock_kind> *)&local_468,
             (Matcher<pstore::file::file_base::blocking_mode> *)gmock_a3);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            ::InternalExpectedAt
                      (&local_440,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                       ,0x10f,"file",
                       "lock (5UL, std::size_t{7}, mock_file::lock_kind::exclusive_write, mock_file::blocking_mode::non_blocking)"
                      );
  local_450 = (bool *)operator_new(1);
  *local_450 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_448,local_450);
  impl = (ActionInterface<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
          *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_001e6c28;
  bVar1 = *local_450;
  *(bool *)&impl[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&impl[1]._vptr_ActionInterface + 1) = bVar1;
  testing::
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::Action((Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            *)&local_4b8,impl);
  testing::internal::
  TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::WillOnce(this_00,(Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
                      *)&local_4b8);
  if ((code *)local_4a8._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_4a8._M_allocated_capacity)(&local_4b8,&local_4b8,3);
  }
  if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
  }
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_440.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .super__Head_base<0UL,_testing::Matcher<unsigned_long>,_false>);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_440.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>);
  testing::internal::MatcherBase<pstore::file::file_base::lock_kind>::~MatcherBase
            ((MatcherBase<pstore::file::file_base::lock_kind> *)
             &local_440.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .super__Head_base<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_false>);
  testing::internal::MatcherBase<pstore::file::file_base::blocking_mode>::~MatcherBase
            ((MatcherBase<pstore::file::file_base::blocking_mode> *)&local_440.matchers_);
  testing::internal::MatcherBase<pstore::file::file_base::blocking_mode>::~MatcherBase(&local_3d8);
  testing::internal::MatcherBase<pstore::file::file_base::lock_kind>::~MatcherBase(&local_468);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_480);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)local_498);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_4b8,5);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)local_498,7);
  anon_unknown.dwarf_1432f::mock_file::gmock_unlock
            ((MockSpec<void_(unsigned_long,_unsigned_long)> *)&local_440,&local_3c0,
             (Matcher<unsigned_long> *)&local_4b8,(Matcher<unsigned_long> *)local_498);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::InternalExpectedAt
                      ((MockSpec<void_(unsigned_long,_unsigned_long)> *)&local_440,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                       ,0x111,"file","unlock (5UL, std::size_t{7})");
  testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::Times(this_01,1);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_440.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .super__Head_base<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_false>);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_440.matchers_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)local_498);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_4b8);
  pstore::file::range_lock::range_lock
            ((range_lock *)&local_440,&local_3c0.super_file_base,5,7,exclusive_write);
  local_498[0] = (internal)pstore::file::range_lock::try_lock((range_lock *)&local_440);
  local_490 = (VTable *)0x0;
  if (!(bool)local_498[0]) {
    testing::Message::Message((Message *)&local_480);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_4b8,(internal *)local_498,(AssertionResult *)0x1a4761,"false","true"
               ,(char *)gmock_a3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x118,(char *)local_4b8._M_unused._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_468,(Message *)&local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_468);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_unused._0_8_ != &local_4a8) {
      operator_delete(local_4b8._M_unused._M_object,(ulong)(local_4a8._M_allocated_capacity + 1));
    }
    if (local_480.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
        (_func_int **)0x0) {
      (**(code **)(*local_480.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))
                ();
    }
  }
  if (local_490 != (VTable *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_490,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_490);
  }
  local_498[0] = (internal)
                 local_440.matchers_.
                 super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
                 .
                 super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
                 .
                 super__Tuple_impl<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
                 .super__Tuple_impl<3UL,_testing::Matcher<pstore::file::file_base::blocking_mode>_>.
                 super__Head_base<3UL,_testing::Matcher<pstore::file::file_base::blocking_mode>,_false>
                 ._M_head_impl.super_MatcherBase<pstore::file::file_base::blocking_mode>.buffer_.i.
                 _4_1_;
  local_490 = (VTable *)0x0;
  if (local_440.matchers_.
      super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
      .
      super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
      .
      super__Tuple_impl<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
      .super__Tuple_impl<3UL,_testing::Matcher<pstore::file::file_base::blocking_mode>_>.
      super__Head_base<3UL,_testing::Matcher<pstore::file::file_base::blocking_mode>,_false>.
      _M_head_impl.super_MatcherBase<pstore::file::file_base::blocking_mode>.buffer_.i._4_1_ == '\0'
     ) {
    testing::Message::Message((Message *)&local_480);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_4b8,(internal *)local_498,(AssertionResult *)0x1a462b,"false","true"
               ,(char *)gmock_a3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x119,(char *)local_4b8._M_unused._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_468,(Message *)&local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_468);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_unused._0_8_ != &local_4a8) {
      operator_delete(local_4b8._M_unused._M_object,(ulong)(local_4a8._M_allocated_capacity + 1));
    }
    if (local_480.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
        (_func_int **)0x0) {
      (**(code **)(*local_480.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))
                ();
    }
  }
  if (local_490 != (VTable *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_490,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_490);
  }
  pstore::file::range_lock::unlock((range_lock *)&local_440);
  pstore::file::range_lock::~range_lock((range_lock *)&local_440);
  testing::internal::FunctionMocker<void_(unsigned_long,_unsigned_long)>::~FunctionMocker
            (&local_3c0.gmock02_unlock_96);
  testing::internal::
  FunctionMocker<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::~FunctionMocker(&local_3c0.gmock04_lock_95);
  testing::internal::FunctionMocker<long_()>::~FunctionMocker(&local_3c0.gmock10_latest_time_93);
  testing::internal::FunctionMocker<void_(unsigned_long)>::~FunctionMocker
            (&local_3c0.gmock01_truncate_92);
  testing::internal::FunctionMocker<unsigned_long_()>::~FunctionMocker(&local_3c0.gmock00_size_91);
  testing::internal::FunctionMocker<void_(pstore::gsl::not_null<const_void_*>,_unsigned_long)>::
  ~FunctionMocker(&local_3c0.gmock02_write_buffer_90);
  testing::internal::FunctionMocker<unsigned_long_(pstore::gsl::not_null<void_*>,_unsigned_long)>::
  ~FunctionMocker(&local_3c0.gmock02_read_buffer_89);
  testing::internal::FunctionMocker<unsigned_long_()>::~FunctionMocker(&local_3c0.gmock00_tell_88);
  testing::internal::FunctionMocker<void_(unsigned_long)>::~FunctionMocker
            (&local_3c0.gmock01_seek_87);
  testing::internal::
  FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::~FunctionMocker(&local_3c0.gmock10_path_86);
  testing::internal::FunctionMocker<bool_()>::~FunctionMocker
            (&local_3c0.gmock10_is_writable_hook_83);
  testing::internal::FunctionMocker<bool_()>::~FunctionMocker(&local_3c0.gmock10_is_open_hook_80);
  testing::internal::FunctionMocker<void_()>::~FunctionMocker(&local_3c0.gmock00_close_76);
  pstore::file::file_base::~file_base(&local_3c0.super_file_base);
  return;
}

Assistant:

TEST (RangeLock, TryLockSucceeds) {
    mock_file file;

    // Set up the test expectations.
    using ::testing::_;
    using ::testing::Return;
    EXPECT_CALL (file, lock (UINT64_C (5), std::size_t{7}, mock_file::lock_kind::exclusive_write,
                             mock_file::blocking_mode::non_blocking))
        .WillOnce (Return (true));
    EXPECT_CALL (file, unlock (UINT64_C (5), std::size_t{7})).Times (1);

    pstore::file::range_lock lock (&file,
                                   UINT64_C (5),   // offset
                                   std::size_t{7}, // size
                                   mock_file::lock_kind::exclusive_write);
    bool locked = lock.try_lock ();
    EXPECT_TRUE (locked);
    EXPECT_TRUE (lock.is_locked ());
    lock.unlock ();
}